

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_trotter.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  ostream *poVar2;
  anon_class_1_0_00000001 local_e2;
  anon_class_1_0_00000001 local_e1;
  int local_e0;
  anon_class_1_0_00000001 f_1;
  anon_class_1_0_00000001 f;
  int r;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  int local_2c;
  int local_28;
  int test;
  int qstp;
  int qmax;
  int qmin;
  char type;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  qmax._3_1_ = 'd';
  qstp = 10;
  test = 0x14;
  local_28 = 2;
  local_2c = 3;
  if (1 < argc) {
    qmax._3_1_ = *argv[1];
  }
  _qmin = argv;
  argv_local._0_4_ = argc;
  if (2 < argc) {
    pcVar1 = argv[2];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar1,&local_51);
    qstp = std::__cxx11::stoi(&local_50,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  if (3 < (int)argv_local) {
    pcVar1 = _qmin[3];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,pcVar1,&local_89);
    test = std::__cxx11::stoi(&local_88,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
  }
  if (4 < (int)argv_local) {
    pcVar1 = _qmin[4];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,pcVar1,&local_b1);
    local_28 = std::__cxx11::stoi(&local_b0,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
  }
  if (5 < (int)argv_local) {
    pcVar1 = _qmin[5];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&r,pcVar1,(allocator<char> *)&f);
    local_2c = std::__cxx11::stoi((string *)&r,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&r);
    std::allocator<char>::~allocator((allocator<char> *)&f);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"nb qubits = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,qstp);
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_28);
  poVar2 = std::operator<<(poVar2,":");
  std::ostream::operator<<(poVar2,test);
  local_e0 = 0;
  if (qmax._3_1_ == 's') {
    poVar2 = std::operator<<((ostream *)&std::cout,", T = std::complex<float>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_e0 = timings<std::complex<float>,main::__0>(qstp,test,local_28,local_2c,&local_e1,3,3);
  }
  else if (qmax._3_1_ == 'd') {
    poVar2 = std::operator<<((ostream *)&std::cout,", T = std::complex<double>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_e0 = timings<std::complex<double>,main::__1>(qstp,test,local_28,local_2c,&local_e2,3,3);
  }
  else {
    local_e0 = -100;
  }
  return local_e0;
}

Assistant:

int main( int argc , char *argv[] ) {

  // defaults
  char type = 'd' ;
  int  qmin = 10 ;
  int  qmax = 20 ;
  int  qstp = 2 ;
  int  test = 3 ;

  // arguments
  if ( argc > 1 ) type = argv[1][0] ;
  if ( argc > 2 ) qmin = std::stoi( argv[2] ) ;
  if ( argc > 3 ) qmax = std::stoi( argv[3] ) ;
  if ( argc > 4 ) qstp = std::stoi( argv[4] ) ;
  if ( argc > 5 ) test = std::stoi( argv[5] ) ;
  std::cout << "nb qubits = " << qmin << ":" << qstp << ":" << qmax ;

  int r = 0 ;
  if ( type == 's' ) {
    // float
    std::cout << ", T = std::complex<float>" << std::endl ;
    using T = std::complex< float > ;
    auto f = [&] ( qclab::QCircuit< T >& circuit ) { trotter( circuit ) ; } ;
    r = timings< T >( qmin , qmax , qstp , test , f ) ;
  } else if ( type == 'd' ) {
    // double
    using T = std::complex< double > ;
    auto f = [&] ( qclab::QCircuit< T >& circuit ) { trotter( circuit ) ; } ;
    std::cout << ", T = std::complex<double>" << std::endl ;
    r = timings< T >( qmin , qmax , qstp , test , f ) ;
  } else {
    r = -100 ;
  }
  return r ;

}